

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O1

void __thiscall cmCTestVC::cmCTestVC(cmCTestVC *this,cmCTest *ct,ostream *log)

{
  this->_vptr_cmCTestVC = (_func_int **)&PTR__cmCTestVC_006a2158;
  this->CTest = ct;
  this->Log = log;
  (this->CommandLineTool)._M_dataplus._M_p = (pointer)&(this->CommandLineTool).field_2;
  (this->CommandLineTool)._M_string_length = 0;
  (this->CommandLineTool).field_2._M_local_buf[0] = '\0';
  (this->SourceDirectory)._M_dataplus._M_p = (pointer)&(this->SourceDirectory).field_2;
  (this->SourceDirectory)._M_string_length = 0;
  (this->SourceDirectory).field_2._M_local_buf[0] = '\0';
  (this->UpdateCommandLine)._M_dataplus._M_p = (pointer)&(this->UpdateCommandLine).field_2;
  (this->UpdateCommandLine)._M_string_length = 0;
  (this->UpdateCommandLine).field_2._M_local_buf[0] = '\0';
  (this->Unknown).Rev._M_dataplus._M_p = (pointer)&(this->Unknown).Rev.field_2;
  (this->Unknown).Rev._M_string_length = 0;
  (this->Unknown).Rev.field_2._M_local_buf[0] = '\0';
  (this->Unknown).Date._M_dataplus._M_p = (pointer)&(this->Unknown).Date.field_2;
  (this->Unknown).Date._M_string_length = 0;
  (this->Unknown).Date.field_2._M_local_buf[0] = '\0';
  (this->Unknown).Author._M_dataplus._M_p = (pointer)&(this->Unknown).Author.field_2;
  (this->Unknown).Author._M_string_length = 0;
  (this->Unknown).Author.field_2._M_local_buf[0] = '\0';
  (this->Unknown).EMail._M_dataplus._M_p = (pointer)&(this->Unknown).EMail.field_2;
  (this->Unknown).EMail._M_string_length = 0;
  (this->Unknown).EMail.field_2._M_local_buf[0] = '\0';
  (this->Unknown).Committer._M_dataplus._M_p = (pointer)&(this->Unknown).Committer.field_2;
  (this->Unknown).Committer._M_string_length = 0;
  (this->Unknown).Committer.field_2._M_local_buf[0] = '\0';
  (this->Unknown).CommitterEMail._M_dataplus._M_p = (pointer)&(this->Unknown).CommitterEMail.field_2
  ;
  (this->Unknown).CommitterEMail._M_string_length = 0;
  (this->Unknown).CommitterEMail.field_2._M_local_buf[0] = '\0';
  (this->Unknown).CommitDate._M_dataplus._M_p = (pointer)&(this->Unknown).CommitDate.field_2;
  (this->Unknown).CommitDate._M_string_length = 0;
  (this->Unknown).CommitDate.field_2._M_local_buf[0] = '\0';
  (this->Unknown).Log._M_dataplus._M_p = (pointer)&(this->Unknown).Log.field_2;
  (this->Unknown).Log._M_string_length = 0;
  (this->Unknown).Log.field_2._M_local_buf[0] = '\0';
  this->PathCount[0] = 0;
  this->PathCount[1] = 0;
  this->PathCount[2] = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->Unknown).Date,0,(char *)(this->Unknown).Date._M_string_length,0x59cf44);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->Unknown).Author,0,(char *)(this->Unknown).Author._M_string_length,
             0x59cf44);
  std::__cxx11::string::_M_replace
            ((ulong)&this->Unknown,0,(char *)(this->Unknown).Rev._M_string_length,0x59cf44);
  return;
}

Assistant:

cmCTestVC::cmCTestVC(cmCTest* ct, std::ostream& log)
  : CTest(ct)
  , Log(log)
{
  this->PathCount[PathUpdated] = 0;
  this->PathCount[PathModified] = 0;
  this->PathCount[PathConflicting] = 0;
  this->Unknown.Date = "Unknown";
  this->Unknown.Author = "Unknown";
  this->Unknown.Rev = "Unknown";
}